

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::InnerProduct3D_1D_1D::dim_forward
          (InnerProduct3D_1D_1D *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  invalid_argument *piVar4;
  const_reference pvVar5;
  Dim *this_00;
  uint *puVar6;
  ostream *ds;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  Dim *in_RDI;
  ostringstream s_1;
  ostringstream s;
  Dim *in_stack_fffffffffffffc28;
  Dim *in_stack_fffffffffffffc30;
  ostringstream *poVar7;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_stack_fffffffffffffc38;
  ostream *in_stack_fffffffffffffc40;
  iterator in_stack_fffffffffffffc58;
  size_type in_stack_fffffffffffffc60;
  string local_370 [32];
  ostringstream local_350 [380];
  uint local_1d4;
  uint *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1b9;
  string local_1b8 [32];
  ostringstream local_198 [392];
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *local_10;
  
  local_10 = in_RDX;
  sVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if ((sVar3 != 3) &&
     (sVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(local_10), sVar3 != 4)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,"Expected three or four arguments in InnerProduct3D_1D");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
  uVar2 = Dim::ndims(pvVar5);
  if (uVar2 == 3) {
    pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
    uVar2 = Dim::ndims(pvVar5);
    if (uVar2 == 1) {
      pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,2);
      uVar2 = Dim::ndims(pvVar5);
      if (uVar2 == 1) {
        std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
        local_1d4 = Dim::size(in_stack_fffffffffffffc30,
                              (uint)((ulong)in_stack_fffffffffffffc28 >> 0x20));
        local_1d0 = &local_1d4;
        local_1c8 = 1;
        pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,0);
        puVar6 = &pvVar5->bd;
        pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,1);
        this_00 = (Dim *)std::max<unsigned_int>(puVar6,&pvVar5->bd);
        uVar2 = (uint)((ulong)puVar6 >> 0x20);
        pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,2);
        std::max<unsigned_int>(this_00->d,&pvVar5->bd);
        x._M_len = in_stack_fffffffffffffc60;
        x._M_array = in_stack_fffffffffffffc58;
        Dim::Dim(this_00,x,uVar2);
        sVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(local_10);
        if (sVar3 == 4) {
          in_stack_fffffffffffffc40 = (ostream *)&in_RDI->bd;
          pvVar5 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,3);
          puVar6 = std::max<unsigned_int>((uint *)in_stack_fffffffffffffc40,&pvVar5->bd);
          in_RDI->bd = *puVar6;
        }
        sVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(local_10);
        if (sVar3 == 4) {
          std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](local_10,3);
          bVar1 = cnn::operator!=(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
          if (bVar1) {
            poVar7 = local_350;
            std::__cxx11::ostringstream::ostringstream(poVar7);
            ds = std::operator<<((ostream *)poVar7,"Bad input dimensions in InnerProduct3D_1D_1D: ")
            ;
            cnn::operator<<(in_stack_fffffffffffffc40,
                            (vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)ds);
            piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::__cxx11::ostringstream::str();
            std::invalid_argument::invalid_argument(piVar4,local_370);
            __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
        }
        return in_RDI;
      }
    }
  }
  poVar7 = local_198;
  std::__cxx11::ostringstream::ostringstream(poVar7);
  std::operator<<((ostream *)poVar7,"Bad input dimensions in InnerProduct3D_1D_1D: ");
  cnn::operator<<(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  local_1b9 = 1;
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::invalid_argument::invalid_argument(piVar4,local_1b8);
  local_1b9 = 0;
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim InnerProduct3D_1D_1D::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 3 && xs.size() != 4)
    throw std::invalid_argument("Expected three or four arguments in InnerProduct3D_1D");
  if (xs[0].ndims() != 3 ||
      xs[1].ndims() != 1 ||
      xs[2].ndims() != 1) {
    // TODO fix add check
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  Dim d({xs[0].size(0)}, max(max(xs[0].bd, xs[1].bd), xs[2].bd));
  if(xs.size() == 4) d.bd = max(d.bd, xs[3].bd);
  if (xs.size() == 4 && xs[3] != d) {
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  return d;
}